

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

bool xercesc_4_0::XMLUri::processAuthority(XMLCh *authSpec,XMLSize_t authLen)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int port;
  ulong uVar4;
  int iVar5;
  XMLSize_t hostLen;
  ulong uVar6;
  XMLSize_t XVar7;
  XMLCh *local_40;
  XMLCh *local_38;
  
  iVar2 = XMLString::indexOf(authSpec,L'@');
  if ((ulong)(long)iVar2 < authLen) {
    uVar6 = (ulong)(iVar2 + 1);
    local_40 = authSpec;
  }
  else {
    uVar6 = 0;
    local_40 = L"";
    iVar2 = 0;
  }
  hostLen = authLen - uVar6;
  if ((authLen < uVar6 || hostLen == 0) || (authSpec[uVar6] != L'[')) {
    iVar3 = XMLString::indexOf(authSpec + uVar6,L':');
    if ((ulong)(long)iVar3 < authLen) goto LAB_00255681;
  }
  else {
    iVar3 = XMLString::indexOf(authSpec + uVar6,L']');
    if ((iVar3 != -1) &&
       ((authLen <= (ulong)(long)iVar3 ||
        (((uVar4 = (long)iVar3 + uVar6 + 1, uVar4 < authLen && (authSpec[uVar4] == L':')) &&
         (iVar3 = iVar3 + 1, iVar3 != -1)))))) {
LAB_00255681:
      local_38 = authSpec + uVar6;
      hostLen = (XMLSize_t)iVar3;
      XVar7 = uVar6 + (long)(iVar3 + 1);
      iVar5 = -1;
      port = iVar5;
      if ((XVar7 < authLen && iVar3 != 0) && (authSpec[XVar7] != L'\0')) {
        port = 0;
        do {
          if ((ushort)(authSpec[XVar7] + L'ￆ') < 0xfff6) {
            local_40 = L"";
            iVar2 = 0;
            hostLen = 0;
            local_38 = L"";
            port = iVar5;
            break;
          }
          port = (uint)(ushort)authSpec[XVar7] + port * 10 + -0x30;
          XVar7 = XVar7 + 1;
        } while (authLen != XVar7);
      }
      goto LAB_002556f3;
    }
  }
  local_38 = authSpec + uVar6;
  port = -1;
LAB_002556f3:
  bVar1 = isValidServerBasedAuthority(local_38,hostLen,port,local_40,(long)iVar2);
  if (bVar1) {
    return true;
  }
  bVar1 = isValidRegistryBasedAuthority(authSpec,authLen);
  return bVar1;
}

Assistant:

bool XMLUri::processAuthority( const XMLCh* const authSpec
                             , const XMLSize_t authLen)
{
    int index = XMLString::indexOf(authSpec, chAt);
    XMLSize_t start = 0;

    // server = [ [ userinfo "@" ] hostport ]
    // userinfo is everything up @,
    const XMLCh* userinfo;
    int userInfoLen = 0;
    if ((index != -1) && (XMLSize_t(index) < authLen))
    {
        userinfo = authSpec;
        userInfoLen = index;
        start = index + 1;
    }
    else
    {
        userinfo = XMLUni::fgZeroLenString;
    }

    // hostport = host [ ":" port ]
    // host is everything up to ':', or up to
    // and including ']' if followed by ':'.
    //
    // Search for port boundary.
    const XMLCh* host;
    XMLSize_t hostLen = 0;
    if ((start < authLen) && (authSpec[start] == chOpenSquare))
    {
    	index = XMLString::indexOf(&(authSpec[start]), chCloseSquare);
    	if ((index != -1) && (XMLSize_t(index) < authLen))
    	{
            // skip the ']'
            index = ((start + index + 1) < authLen
              && authSpec[start + index + 1] == chColon) ? index+1 : -1;
    	}
    }
    else
    {
        index = XMLString::indexOf(&(authSpec[start]), chColon);
        if (index!=-1 && XMLSize_t(index) >= authLen)
            index = -1;
    }

    host = &(authSpec[start]);
    if (index != -1)
    {
        hostLen = index;
        start += index + 1;  // skip the :
    }
    else
    {
        hostLen = authLen - start;
        start = authLen;
    }

    // port is everything after ":"
    int port = -1;
    if ((hostLen) &&   // non empty host
        (index != -1)                    &&   // ":" found
        (start < authLen)                     )   // ":" is not the last
    {
        const XMLCh* portStr = &(authSpec[start]);
        if (*portStr)
        {
            port = 0;
            for (XMLSize_t i=0; i<(authLen - start); i++)
            {
                if (portStr[i] < chDigit_0 || portStr[i] > chDigit_9)
                {
                  // Assume this is a registry-based authority.
                  //
                  port = -1;
                  hostLen = 0;
                  host = XMLUni::fgZeroLenString;
                  userInfoLen = 0;
                  userinfo = XMLUni::fgZeroLenString;
                  break;
                }

                port = (port * 10) + (int) (portStr[i] - chDigit_0);
            }
        }
    }

    return isValidServerBasedAuthority(host, hostLen, port, userinfo, userInfoLen)
      || isValidRegistryBasedAuthority(authSpec, authLen);
}